

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O3

int __thiscall
gmlc::utilities::numeric_conversionComplete<int>(utilities *this,string_view V,int defValue)

{
  int iVar1;
  int iVar2;
  int iVar3;
  utilities *puVar4;
  string_view input;
  size_t rem;
  utilities *local_30;
  
  input._M_len = (byte *)V._M_len;
  iVar3 = (int)V._M_str;
  iVar1 = iVar3;
  if ((((this != (utilities *)0x0) && (numCheck[*input._M_len] == '\x01')) &&
      (numCheckEnd[(input._M_len + -1)[(long)this]] == '\x01')) &&
     (input._M_str = (char *)&local_30,
     iVar1 = strViewToInteger<int>(this,input,(size_t *)numCheckEnd), local_30 < this)) {
    do {
      puVar4 = local_30 + 1;
      iVar2 = isspace((int)(char)(input._M_len + -1)[(long)puVar4]);
      if (iVar2 == 0) {
        return iVar3;
      }
      local_30 = puVar4;
    } while (puVar4 != this);
  }
  return iVar1;
}

Assistant:

X numeric_conversionComplete(std::string_view V, const X defValue)
{
    if (nonNumericFirstOrLastCharacter(V)) {
        return defValue;
    }
    try {
        size_t rem;
        X res = numConvComp<X>(V, rem);
        while (rem < V.length()) {
            if (!(isspace(V[rem]))) {
                res = defValue;
                break;
            }
            ++rem;
        }
        return res;
    }
    catch (const std::invalid_argument&) {
        return defValue;
    }
}